

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::paintDropIndicator(QAbstractItemViewPrivate *this,QPainter *painter)

{
  QRect *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QStyleOption opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->showDropIndicator == true) && (this->state == DraggingState)) {
    this_00 = &this->dropIndicatorRect;
    bVar2 = QRect::isNull(this_00);
    if (!bVar2) {
      QWidget::cursor((QWidget *)&opt);
      iVar3 = QCursor::shape();
      QCursor::~QCursor((QCursor *)&opt);
      if (iVar3 != 0xe) {
        opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStyleOption::QStyleOption(&opt,1,0);
        QStyleOption::initFrom
                  (&opt,*(QWidget **)
                         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.field_0x8);
        opt.rect.x1.m_i = (this_00->x1).m_i;
        opt.rect.y1.m_i = (this_00->y1).m_i;
        opt.rect.x2.m_i = (this->dropIndicatorRect).x2.m_i;
        opt.rect.y2.m_i = (this->dropIndicatorRect).y2.m_i;
        pQVar4 = QWidget::style(*(QWidget **)
                                 &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                  super_QWidgetPrivate.field_0x8);
        (**(code **)(*(long *)pQVar4 + 0xb0))
                  (pQVar4,0x2b,&opt,painter,
                   *(undefined8 *)
                    &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x8);
        QStyleOption::~QStyleOption(&opt);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void paintDropIndicator(QPainter *painter)
    {
        if (showDropIndicator && state == QAbstractItemView::DraggingState
            && !dropIndicatorRect.isNull()
#ifndef QT_NO_CURSOR
            && viewport->cursor().shape() != Qt::ForbiddenCursor
#endif
        ) {
            QStyleOption opt;
            opt.initFrom(q_func());
            opt.rect = dropIndicatorRect;
            q_func()->style()->drawPrimitive(QStyle::PE_IndicatorItemViewItemDrop, &opt, painter, q_func());
        }
    }